

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_generate.cc
# Opt level: O1

Trie * load_dictionary(Trie *__return_storage_ptr__,char *fname)

{
  char *str_00;
  char cVar1;
  istream *piVar2;
  char *pcVar3;
  char *str;
  double dVar4;
  string line;
  ifstream h;
  char *local_258;
  undefined8 local_250;
  char local_248 [16];
  long local_238 [65];
  
  std::ifstream::ifstream((istream *)local_238,fname,_S_in);
  __return_storage_ptr__->max_count = 0;
  __return_storage_ptr__->terminus = 0;
  __return_storage_ptr__->count = 0;
  (__return_storage_ptr__->max_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->max_string).field_2;
  (__return_storage_ptr__->max_string)._M_string_length = 0;
  (__return_storage_ptr__->max_string).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->children).super__Vector_base<Trie_*,_std::allocator<Trie_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_250 = 0;
  local_248[0] = '\0';
  local_258 = local_248;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_258,cVar1);
    str_00 = local_258;
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    pcVar3 = strchr(local_258,0x20);
    if (pcVar3 == (char *)0x0) {
      Trie::insert(__return_storage_ptr__,str_00,1);
    }
    else {
      *pcVar3 = '\0';
      dVar4 = atof(str_00);
      Trie::insert(__return_storage_ptr__,pcVar3 + 1,
                   (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
    }
  }
  if (local_258 != local_248) {
    operator_delete(local_258);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

Trie load_dictionary(const char* fname)
{ ifstream h(fname);
  Trie t;
  string line;
  while (getline(h,line))
  { const char* str = line.c_str();
    char* space = (char*)strchr(str, ' ');
    if (space)
    { *space = 0;
      space++;
      t.insert(space, atof(str));
    }
    else
      t.insert(str);
  }
  return t;
}